

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastEqBoolInt(Lowerer *this,Instr *instr,bool *pNeedHelper,bool isInHelper)

{
  IRKind IVar1;
  OpCode OVar2;
  undefined1 *puVar3;
  code *pcVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar5;
  bool bVar6;
  bool bVar7;
  OpndKind OVar8;
  OpndKind OVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int32 iVar13;
  undefined4 *puVar14;
  LabelInstr *pLVar15;
  LabelInstr *branchTarget;
  undefined7 uVar22;
  BranchInstr *pBVar16;
  LabelInstr *target;
  Opnd *pOVar17;
  LabelInstr *instr_00;
  RegOpnd *pRVar18;
  IntConstOpnd *pIVar19;
  Opnd *pOVar20;
  LabelInstr *pLVar21;
  undefined4 uVar23;
  undefined8 uVar24;
  undefined8 extraout_RDX;
  Func *func;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar25;
  char *this_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar26;
  Lowerer *this_01;
  LibraryValue LVar27;
  LibraryValue valueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar28;
  byte bVar29;
  ulong uVar30;
  bool bVar31;
  LabelInstr *local_90;
  LabelInstr *local_80;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_56;
  LibraryValue local_54;
  undefined8 local_50;
  LibraryValue local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5bce,"(instr)","instr");
    if (!bVar6) goto LAB_005dd72d;
    *puVar14 = 0;
  }
  OVar2 = instr->m_opcode;
  if (((OVar2 - 0x14 < 0x2f) && ((0x600000000003U >> ((ulong)(OVar2 - 0x14) & 0x3f) & 1) != 0)) ||
     (OVar2 - 0x196 < 2)) {
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  IVar1 = instr->m_kind;
  LVar27 = ValueInvalid;
  switch(OVar2) {
  case BrEq_A:
  case BrSrEq_A:
    goto switchD_005dc6e7_caseD_3b;
  case BrNeq_A:
  case BrSrNeq_A:
    break;
  case BrFalse_A:
  case BrTrue_A:
  case BrGe_A:
  case BrGt_A:
  case BrLt_A:
  case BrLe_A:
    goto switchD_005dc6e7_caseD_3c;
  default:
    switch(OVar2) {
    case CmEq_A:
    case CmSrEq_A:
      goto switchD_005dc6e7_caseD_3b;
    case CmGe_A:
    case CmGt_A:
    case CmLt_A:
    case CmLe_A:
      goto switchD_005dc6e7_caseD_3c;
    case CmNeq_A:
    case CmSrNeq_A:
      goto switchD_005dc6e7_caseD_40;
    default:
      switch(OVar2) {
      case BrNotEq_A:
      case BrSrNotEq_A:
        goto switchD_005dc6e7_caseD_40;
      case BrNotNeq_A:
      case BrSrNotNeq_A:
        goto switchD_005dc6e7_caseD_3b;
      }
    }
    goto switchD_005dc718_default;
  }
switchD_005dc6e7_caseD_40:
  LVar27 = ValueUndeclBlockVar;
switchD_005dc6e7_caseD_3b:
  paVar28 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr->m_src1;
  paVar25 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)instr->m_src2;
  local_40 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)this;
  if (paVar28 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0 ||
      paVar25 == (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5bfe,"(src1 && src2)","src1 && src2");
    if (!bVar6) goto LAB_005dd72d;
    *puVar14 = 0;
  }
  else {
    local_54 = LVar27;
    if (IVar1 == InstrKindBranch) {
      if (instr->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar7) goto LAB_005dd72d;
        *puVar14 = 0;
      }
      local_90 = (LabelInstr *)instr[1].m_next;
      pLVar15 = IR::Instr::GetOrCreateContinueLabel(instr,isInHelper);
    }
    else {
      pLVar15 = (LabelInstr *)0x0;
      local_90 = (LabelInstr *)0x0;
    }
    *pNeedHelper = true;
    branchTarget = IR::Instr::GetOrCreateContinueLabel(instr,isInHelper);
    local_32 = paVar28[4];
    bVar7 = ValueType::IsLikelyBoolean((ValueType *)&local_32.field_0);
    if (bVar7) {
      local_56 = paVar25[4];
      bVar7 = ValueType::IsLikelyTaggedInt((ValueType *)&local_56.field_0);
      paVar26 = paVar25;
      if (!bVar7) goto LAB_005dc87b;
LAB_005dc8ae:
      OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
      OVar9 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
      if (OVar8 == OpndKindIntConst) {
        if (OVar9 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar7) goto LAB_005dd72d;
          *puVar14 = 0;
        }
        puVar3 = *(undefined1 **)(paVar26 + 8);
        uVar22 = (undefined7)((ulong)puVar3 >> 8);
        if (puVar3 == (undefined1 *)0x0) {
          bVar7 = true;
          local_44 = ValueInvalid;
          local_50 = (LabelInstr *)CONCAT44(local_50._4_4_,(int)CONCAT71(uVar22,1));
        }
        else if (puVar3 == &DAT_00000001) {
          local_50 = (LabelInstr *)CONCAT44(local_50._4_4_,(int)CONCAT71(uVar22,1));
          bVar7 = true;
          local_44 = (LibraryValue)CONCAT71(uVar22,1);
        }
        else {
          bVar7 = true;
          local_50 = (LabelInstr *)((ulong)local_50._4_4_ << 0x20);
          local_44 = ValueInvalid;
        }
      }
      else {
        OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
        if (OVar9 != OpndKindAddr) {
          if (OVar8 != OpndKindIntConst) {
            OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
            if (((OVar8 != OpndKindInt64Const) &&
                (OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0), OVar8 != OpndKindAddr)) &&
               ((OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0), OVar8 != OpndKindHelperCall
                && (OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0),
                   OVar8 != OpndKindFloatConst)))) {
              OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
              local_50 = (LabelInstr *)((ulong)local_50._4_4_ << 0x20);
              local_44 = ValueInvalid;
              bVar7 = false;
              if (OVar8 == OpndKindSimd128Const) {
                return false;
              }
              goto LAB_005dcb82;
            }
          }
          goto switchD_005dc718_default;
        }
        if (OVar8 != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
          if (!bVar7) goto LAB_005dd72d;
          *puVar14 = 0;
        }
        if (*(char *)((long)paVar26 + 0x29) == '\n') {
LAB_005dc9f2:
          uVar30 = *(ulong *)(paVar26 + 0x10) & 0xffff000000000000;
          if ((*(ulong *)(paVar26 + 0x10) & 0x1ffff00000000) != 0x1000000000000 &&
              uVar30 == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar14 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                               ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                               "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar7) goto LAB_005dd72d;
            *puVar14 = 0;
          }
          uVar24 = 0;
          uVar23 = 0;
          LVar27 = ValueInvalid;
          bVar7 = false;
          if (uVar30 == 0x1000000000000) {
            iVar13 = Js::TaggedInt::ToInt32(*(Var *)(paVar26 + 0x10));
            bVar7 = true;
            uVar22 = (undefined7)((ulong)uVar24 >> 8);
            if (iVar13 == 0) {
              LVar27 = ValueInvalid;
              uVar23 = (undefined4)CONCAT71(uVar22,1);
            }
            else if (iVar13 == 1) {
              uVar23 = (undefined4)CONCAT71(uVar22,1);
              LVar27 = (LibraryValue)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
              bVar7 = true;
            }
            else {
              uVar23 = 0;
              LVar27 = ValueInvalid;
            }
          }
        }
        else {
          uVar23 = 0;
          LVar27 = ValueInvalid;
          bVar7 = false;
          if (*(char *)((long)paVar26 + 0x29) == '\x01') goto LAB_005dc9f2;
        }
        local_50 = (LabelInstr *)CONCAT44(local_50._4_4_,uVar23);
        local_44 = LVar27;
        if (!bVar7) goto switchD_005dc718_default;
      }
LAB_005dcb82:
      OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0);
      OVar9 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0);
      if (OVar8 == OpndKindIntConst) {
        if (OVar9 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                              ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar10) goto LAB_005dd72d;
          *puVar14 = 0;
        }
        bVar31 = *(long *)(paVar28 + 8) != 0;
        bVar10 = true;
      }
      else if (OVar9 == OpndKindAddr) {
        OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
        if (OVar8 != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                              ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
          if (!bVar10) goto LAB_005dd72d;
          *puVar14 = 0;
        }
        if (*(char *)((long)paVar26 + 0x29) == '\n') {
LAB_005dccda:
          bVar12 = Js::TaggedInt::Is(*(Var *)(paVar26 + 0x10));
          bVar31 = false;
          bVar10 = false;
          bVar11 = false;
          if (bVar12) {
            iVar13 = Js::TaggedInt::ToInt32(*(Var *)(paVar26 + 0x10));
            bVar31 = iVar13 != 0;
            bVar10 = true;
            bVar11 = true;
          }
        }
        else {
          bVar31 = false;
          bVar10 = false;
          bVar11 = false;
          if (*(char *)((long)paVar26 + 0x29) == '\x01') goto LAB_005dccda;
        }
        if (!bVar11) goto switchD_005dc718_default;
      }
      else {
        OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0);
        if (((OVar8 == OpndKindIntConst) ||
            (OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0), OVar8 == OpndKindInt64Const)) ||
           ((OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0), OVar8 == OpndKindAddr ||
            ((OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0), OVar8 == OpndKindHelperCall ||
             (OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0), OVar8 == OpndKindFloatConst)))))
           ) goto switchD_005dc718_default;
        OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0);
        bVar31 = false;
        bVar10 = false;
        if (OVar8 == OpndKindSimd128Const) {
          return false;
        }
      }
      local_32 = paVar26[4];
      bVar11 = ValueType::IsTaggedInt((ValueType *)&local_32.field_0);
      if (bVar11) {
        local_56 = paVar28[4];
        paVar25 = &local_56;
        bVar11 = ValueType::IsBoolean((ValueType *)&paVar25->field_0);
        if (!bVar11) goto LAB_005dcd16;
        *pNeedHelper = false;
        local_80 = (LabelInstr *)0x0;
      }
      else {
LAB_005dcd16:
        local_80 = IR::LabelInstr::New(Label,*(Func **)local_40,true);
        OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
        if (((((OVar8 != OpndKindIntConst) &&
              (OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0), OVar8 != OpndKindInt64Const))
             && (OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0), OVar8 != OpndKindAddr)) &&
            ((OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0), OVar8 != OpndKindHelperCall &&
             (OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0), OVar8 != OpndKindFloatConst))))
           && (OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0), OVar8 != OpndKindSimd128Const))
        {
          local_32 = paVar26[4];
          bVar11 = ValueType::IsTaggedInt((ValueType *)&local_32.field_0);
          if (!bVar11) {
            OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
            if (OVar8 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar11 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                  ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar11) goto LAB_005dd72d;
              *puVar14 = 0;
            }
            LowererMD::GenerateSmIntTest
                      ((LowererMD *)&local_40[4].field_0,(Opnd *)&paVar26->field_0,instr,local_80,
                       (Instr **)0x0,false);
          }
        }
        paVar25 = paVar28;
        OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0);
        if (((OVar8 != OpndKindIntConst) &&
            (paVar25 = paVar28, OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0),
            OVar8 != OpndKindInt64Const)) &&
           ((paVar25 = paVar28, OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0),
            OVar8 != OpndKindAddr &&
            (((paVar25 = paVar28, OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0),
              OVar8 != OpndKindHelperCall &&
              (paVar25 = paVar28, OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0),
              OVar8 != OpndKindFloatConst)) &&
             (paVar25 = paVar28, OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0),
             OVar8 != OpndKindSimd128Const)))))) {
          local_32 = paVar28[4];
          paVar25 = &local_32;
          bVar11 = ValueType::IsBoolean((ValueType *)&paVar25->field_0);
          if (!bVar11) {
            local_32 = paVar28[4];
            bVar11 = ValueType::IsObject((ValueType *)&local_32.field_0);
            if (!bVar11) {
              paVar25 = local_40 + 4;
              pRVar18 = IR::Opnd::AsRegOpnd((Opnd *)&paVar28->field_0);
              LowererMD::GenerateObjectTest
                        ((LowererMD *)&paVar25->field_0,&pRVar18->super_Opnd,instr,local_80,false);
            }
            OVar8 = IR::Opnd::GetKind((Opnd *)&paVar28->field_0);
            if (OVar8 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar11 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                  ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar11) goto LAB_005dd72d;
              *puVar14 = 0;
            }
            paVar25 = local_40;
            GenerateJSBooleanTest
                      ((Lowerer *)&local_40->field_0,(RegOpnd *)&paVar28->field_0,instr,local_80,
                       false);
          }
        }
      }
      paVar5 = local_40;
      LVar27 = ValueFalse - (local_54 & 0xff);
      target = pLVar15;
      pLVar21 = local_90;
      if ((byte)local_54 != 0) {
        target = local_90;
        pLVar21 = pLVar15;
      }
      if (bVar6) {
        if (IVar1 == InstrKindBranch) {
LAB_005dcf92:
          pBVar16 = IR::BranchInstr::New(JMP,target,*(Func **)local_40);
          IR::Instr::InsertBefore(instr,&pBVar16->super_Instr);
          pLVar21->field_0x78 = pLVar21->field_0x78 | 0x20;
          goto LAB_005dd6ec;
        }
LAB_005dd3f2:
        pOVar17 = instr->m_dst;
        pOVar20 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,LVar27);
        InsertMove(pOVar17,pOVar20,instr,true);
        func = *(Func **)paVar5;
      }
      else {
        valueType = (local_54 & 0xff) + ValueTrue;
        if (bVar7) {
          if (bVar10) {
            bVar29 = bVar31 ^ (byte)local_44;
            if (IVar1 == InstrKindBranch) {
              if ((bVar29 != 0) || (pLVar15 = pLVar21, (char)local_50 == '\0')) {
                pLVar15 = target;
              }
              pBVar16 = IR::BranchInstr::New(JMP,pLVar15,*(Func **)local_40);
              IR::Instr::InsertBefore(instr,&pBVar16->super_Instr);
              if ((bVar29 != 0) || ((char)local_50 == '\0')) {
                target = pLVar21;
              }
              target->field_0x78 = target->field_0x78 | 0x20;
              goto LAB_005dd6ec;
            }
            pOVar17 = instr->m_dst;
            if ((bVar29 != 0) || ((char)local_50 == '\0')) {
              valueType = LVar27;
            }
            pOVar20 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,valueType);
            InsertMove(pOVar17,pOVar20,instr,true);
            func = *(Func **)paVar5;
          }
          else {
            if (!bVar7) goto LAB_005dd090;
LAB_005dd09f:
            if (IVar1 == InstrKindBranch) {
              if ((char)local_50 == '\0') goto LAB_005dcf92;
              paVar25 = local_40;
              pOVar17 = LoadLibraryValueOpnd
                                  ((Lowerer *)&local_40->field_0,instr,
                                   ValueFalse - (local_44 & 0xff));
              InsertCompareBranch((Lowerer *)&paVar25->field_0,(Opnd *)&paVar28->field_0,pOVar17,
                                  instr->m_opcode,false,local_90,instr,false);
              func = *(Func **)paVar5;
              branchTarget = pLVar15;
            }
            else {
              if ((char)local_50 == '\0') goto LAB_005dd3f2;
              if ((byte)local_54 == (byte)local_44) {
                GenerateBooleanNegate
                          ((Lowerer *)&paVar25->field_0,instr,(Opnd *)&paVar28->field_0,instr->m_dst
                          );
              }
              else {
                InsertMove(instr->m_dst,(Opnd *)&paVar28->field_0,instr,true);
              }
              func = *(Func **)local_40;
            }
          }
        }
        else {
LAB_005dd090:
          if (bVar10) {
            if (bVar7) goto LAB_005dd09f;
            if (IVar1 == InstrKindBranch) {
              paVar28 = local_40 + 4;
              pRVar18 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
              pLVar15 = pLVar21;
              if (bVar31 != false) {
                pLVar15 = target;
              }
              LowererMD::GenerateTaggedZeroTest
                        ((LowererMD *)&paVar28->field_0,&pRVar18->super_Opnd,instr,pLVar15);
              paVar28 = local_40;
              if (bVar31 != false) {
                pIVar19 = IR::IntConstOpnd::New(0x1000000000001,TyVar,*(Func **)local_40,false);
                pRVar18 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
                InsertCompareBranch((Lowerer *)&paVar26->field_0,&pIVar19->super_Opnd,
                                    &pRVar18->super_Opnd,BrNeq_A,false,target,instr,true);
                target = pLVar21;
              }
              func = *(Func **)paVar28;
              branchTarget = target;
            }
            else {
              local_44 = LVar27;
              pLVar15 = IR::LabelInstr::New(Label,*(Func **)local_40,false);
              pLVar21 = IR::LabelInstr::New(Label,*(Func **)paVar5,false);
              pRVar18 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
              LowererMD::GenerateTaggedZeroTest
                        ((LowererMD *)&paVar5[4].field_0,&pRVar18->super_Opnd,instr,pLVar21);
              LVar27 = local_44;
              if (bVar31 != false) {
                pIVar19 = IR::IntConstOpnd::New(0x1000000000001,TyVar,*(Func **)local_40,false);
                pRVar18 = IR::Opnd::AsRegOpnd((Opnd *)&paVar26->field_0);
                InsertCompareBranch((Lowerer *)&paVar26->field_0,&pIVar19->super_Opnd,
                                    &pRVar18->super_Opnd,BrNeq_A,false,pLVar21,instr,true);
                local_54 = local_44;
                LVar27 = valueType;
                valueType = local_54;
              }
              local_54 = valueType;
              IR::Instr::InsertBefore(instr,&pLVar15->super_Instr);
              paVar28 = local_40;
              pOVar17 = instr->m_dst;
              pOVar20 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,LVar27);
              InsertMove(pOVar17,pOVar20,instr,true);
              pBVar16 = IR::BranchInstr::New(JMP,branchTarget,*(Func **)paVar28);
              IR::Instr::InsertBefore(instr,&pBVar16->super_Instr);
              IR::Instr::InsertBefore(instr,&pLVar21->super_Instr);
              pOVar17 = instr->m_dst;
              pOVar20 = LoadLibraryValueOpnd((Lowerer *)&paVar28->field_0,instr,local_54);
              InsertMove(pOVar17,pOVar20,instr,true);
              func = *(Func **)paVar28;
            }
          }
          else {
            local_44 = LVar27;
            pLVar21 = IR::LabelInstr::New(Label,*(Func **)local_40,false);
            instr_00 = IR::LabelInstr::New(Label,*(Func **)paVar5,false);
            OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
            if (OVar8 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar6) goto LAB_005dd72d;
              *puVar14 = 0;
            }
            paVar25 = local_40;
            local_50 = pLVar21;
            LowererMD::GenerateTaggedZeroTest
                      ((LowererMD *)&local_40[4].field_0,(Opnd *)&paVar26->field_0,instr,pLVar21);
            pIVar19 = IR::IntConstOpnd::New(0x1000000000001,TyVar,*(Func **)paVar25,true);
            this_00 = (char *)paVar26;
            OVar8 = IR::Opnd::GetKind((Opnd *)&paVar26->field_0);
            if (OVar8 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar14 = 1;
              this_00 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
              ;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar6) {
LAB_005dd72d:
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar14 = 0;
            }
            if (IVar1 != InstrKindBranch) {
              target = instr_00;
            }
            InsertCompareBranch((Lowerer *)this_00,&pIVar19->super_Opnd,(Opnd *)&paVar26->field_0,
                                BrNeq_A,false,target,instr,true);
            paVar25 = local_40;
            if (IVar1 == InstrKindBranch) {
              paVar26 = local_40;
              pOVar17 = LoadLibraryValueOpnd((Lowerer *)&local_40->field_0,instr,ValueTrue);
              InsertCompareBranch((Lowerer *)&paVar26->field_0,(Opnd *)&paVar28->field_0,pOVar17,
                                  instr->m_opcode,false,local_90,instr,false);
              pBVar16 = IR::BranchInstr::New(JMP,pLVar15,*(Func **)paVar25);
              IR::Instr::InsertBefore(instr,&pBVar16->super_Instr);
              IR::Instr::InsertBefore(instr,&local_50->super_Instr);
              paVar26 = paVar25;
              pOVar17 = LoadLibraryValueOpnd((Lowerer *)&paVar25->field_0,instr,ValueFalse);
              InsertCompareBranch((Lowerer *)&paVar26->field_0,(Opnd *)&paVar28->field_0,pOVar17,
                                  instr->m_opcode,false,local_90,instr,false);
              func = *(Func **)paVar25;
              branchTarget = pLVar15;
            }
            else {
              if ((undefined1)local_54 == '\0') {
                InsertMove(instr->m_dst,(Opnd *)&paVar28->field_0,instr,true);
              }
              else {
                GenerateBooleanNegate
                          ((Lowerer *)this_00,instr,(Opnd *)&paVar28->field_0,instr->m_dst);
              }
              pLVar15 = local_50;
              pBVar16 = IR::BranchInstr::New(JMP,branchTarget,*(Func **)local_40);
              IR::Instr::InsertBefore(instr,&pBVar16->super_Instr);
              this_01 = (Lowerer *)instr;
              IR::Instr::InsertBefore(instr,&pLVar15->super_Instr);
              if ((undefined1)local_54 == '\0') {
                GenerateBooleanNegate(this_01,instr,(Opnd *)&paVar28->field_0,instr->m_dst);
              }
              else {
                InsertMove(instr->m_dst,(Opnd *)&paVar28->field_0,instr,true);
              }
              paVar28 = local_40;
              pBVar16 = IR::BranchInstr::New(JMP,branchTarget,*(Func **)local_40);
              IR::Instr::InsertBefore(instr,&pBVar16->super_Instr);
              IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
              pOVar17 = instr->m_dst;
              pOVar20 = LoadLibraryValueOpnd((Lowerer *)&paVar28->field_0,instr,local_44);
              InsertMove(pOVar17,pOVar20,instr,true);
              func = *(Func **)paVar28;
            }
          }
        }
      }
      pBVar16 = IR::BranchInstr::New(JMP,branchTarget,func);
      IR::Instr::InsertBefore(instr,&pBVar16->super_Instr);
LAB_005dd6ec:
      if (*pNeedHelper != true) {
        return true;
      }
      IR::Instr::InsertBefore(instr,&local_80->super_Instr);
      return true;
    }
LAB_005dc87b:
    local_32 = paVar28[4];
    bVar7 = ValueType::IsLikelyTaggedInt((ValueType *)&local_32.field_0);
    if (bVar7) {
      local_56 = paVar25[4];
      bVar7 = ValueType::IsLikelyBoolean((ValueType *)&local_56.field_0);
      paVar26 = paVar28;
      paVar28 = paVar25;
      if (bVar7) goto LAB_005dc8ae;
    }
  }
switchD_005dc718_default:
switchD_005dc6e7_caseD_3c:
  return false;
}

Assistant:

bool Lowerer::GenerateFastEqBoolInt(IR::Instr * instr, bool *pNeedHelper, bool isInHelper)
{
    Assert(instr);

    // There's a total of 8 modes for this function, based on these inferred flags
    bool isBranchNotCompare = instr->IsBranchInstr();
    bool isStrict = false;
    bool isNegOp = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
        break;
    default:
        break;
    }
    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::CmEq_A:
        isNegOp = false;
        break;
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::CmNeq_A:
        isNegOp = true;
        break;
    default:
        // This opcode is not one of the ones that should be handled here.
        return false;
        break;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    // The instrucions given to this _should_ all be 2-arg.
    Assert(src1 && src2);
    if (!(src1 && src2))
    {
        return false;
    }

    // If it's a branch instruction, we'll want these to be defined
    //IR::BranchInstr *instrBranch = nullptr;
    IR::LabelInstr *targetInstr = nullptr;
    IR::LabelInstr *labelFallthrough = nullptr;

    if (isBranchNotCompare)
    {
        IR::BranchInstr * instrBranch = instr->AsBranchInstr();
        targetInstr = instrBranch->GetTarget();
        labelFallthrough = instrBranch->GetOrCreateContinueLabel(isInHelper);
    }

    // Assume we need the helper until we can show otherwise.
    *pNeedHelper = true;
    // If we don't know the final types well enough at JIT time, a helper block to set
    // the inputs to the correct types will be needed.
    IR::LabelInstr *labelHelper = nullptr;
    // If we're doing a compare and can handle it early, then we want to skip the helper
    IR::LabelInstr *labelDone = instr->GetOrCreateContinueLabel(isInHelper);

    // Normallize for orderings
    IR::Opnd *srcBool = nullptr;
    IR::Opnd *srcInt = nullptr;
    if (src1->GetValueType().IsLikelyBoolean() && src2->GetValueType().IsLikelyTaggedInt())
    {
        srcBool = src1;
        srcInt = src2;
    }
    else if (src1->GetValueType().IsLikelyTaggedInt() && src2->GetValueType().IsLikelyBoolean())
    {
        srcInt = src1;
        srcBool = src2;
    }
    else
    {
        return false;
    }

    // If either instruction is constant, we can simplify the check. If both are constant, we can eliminate it
    bool srcIntConst = false;
    bool srcIntConstVal = false;
    // If we're comparing with a number that is not 0 or 1, then the two are inequal by default
    bool srcIntIsBoolable = false;
    bool srcBoolConst = false;
    bool srcBoolConstVal = false;
    if (srcInt->IsIntConstOpnd())
    {
        IR::IntConstOpnd * constSrcInt = srcInt->AsIntConstOpnd();
        IntConstType constIntVal = constSrcInt->GetValue();
        srcIntConst = true;
        if (constIntVal == 0)
        {
            srcIntConstVal = false;
            srcIntIsBoolable = true;
        }
        else if (constIntVal == 1)
        {
            srcIntConstVal = true;
            srcIntIsBoolable = true;
        }
    }
    else if (srcInt->IsAddrOpnd())
    {
        IR::AddrOpnd * addrSrcInt = srcInt->AsAddrOpnd();
        if (!(addrSrcInt && addrSrcInt->IsVar() && Js::TaggedInt::Is(addrSrcInt->m_address)))
        {
            return false;
        }
        int32 constIntVal = Js::TaggedInt::ToInt32(addrSrcInt->m_address);
        srcIntConst = true;
        if (constIntVal == 0)
        {
            srcIntConstVal = false;
            srcIntIsBoolable = true;
        }
        else if (constIntVal == 1)
        {
            srcIntConstVal = true;
            srcIntIsBoolable = true;
        }
    }
    else if (srcInt->IsConstOpnd())
    {
        // Not handled yet
        return false;
    }
    if (srcBool->IsIntConstOpnd())
    {
        IR::IntConstOpnd * constSrcBool = srcBool->AsIntConstOpnd();
        IntConstType constIntVal = constSrcBool->GetValue();
        srcBoolConst = true;
        srcBoolConstVal = constIntVal != 0;
    }
    else if (srcBool->IsAddrOpnd())
    {
        IR::AddrOpnd * addrSrcBool = srcInt->AsAddrOpnd();
        if (!(addrSrcBool && addrSrcBool->IsVar() && Js::TaggedInt::Is(addrSrcBool->m_address)))
        {
            return false;
        }
        int32 value = Js::TaggedInt::ToInt32(addrSrcBool->m_address);
        srcBoolConst = true;
        srcBoolConstVal = value != 0;
    }
    else if (srcBool->IsConstOpnd())
    {
        // Not handled yet
        return false;
    }

    // Do these checks here, since that way we avoid emitting instructions before exiting earlier
    if (srcInt->GetValueType().IsTaggedInt() && srcBool->GetValueType().IsBoolean()) {
        // ok, we know the types, so no helper needed
        *pNeedHelper = false;
    }
    else
    {
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        // check the types and jump to the helper if incorrect
        if (!srcInt->IsConstOpnd() && !srcInt->GetValueType().IsTaggedInt())
        {
            this->m_lowererMD.GenerateSmIntTest(srcInt->AsRegOpnd(), instr, labelHelper);
        }
        if (!srcBool->IsConstOpnd() && !srcBool->GetValueType().IsBoolean())
        {
            if (!srcBool->GetValueType().IsObject())
            {
                this->m_lowererMD.GenerateObjectTest(srcBool->AsRegOpnd(), instr, labelHelper, false);
            }
            GenerateJSBooleanTest(srcBool->AsRegOpnd(), instr, labelHelper, false);
        }
    }

    // At this point, we know both which operand is an integer and which is a boolean,
    // whether either operand is constant, and what the constant true/false values are
    // for any constant operands. This should allow us to emit some decent code.

    LibraryValue equalResultValue = !isNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
    LibraryValue inequalResultValue = !isNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
    IR::LabelInstr *equalResultTarget = !isNegOp ? targetInstr : labelFallthrough;
    IR::LabelInstr *inequalResultTarget = !isNegOp ? labelFallthrough : targetInstr;

    // For the Sr instructions, we now know that the types are different, so we can immediately
    // decide what the result will be.
    if (isStrict)
    {
        if (isBranchNotCompare)
        {
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, inequalResultTarget, this->m_func));
#if DBG
            // Since we're not making a non-helper path to one of the branches, we need to tell
            // DbCheckPostLower that we are going to have a non-helper label without non-helper
            // branches.
            // Note: this following line isn't good practice in general
            equalResultTarget->m_noHelperAssert = true;
#endif
        }
        else
        {
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    // Now that we've checked the types, we can lower some instructions to quickly do the check
    // in the case that it's not a type-strict strict equality/inequality check.
    else if (srcIntConst && srcBoolConst)
    {
        // If both arguments are constant, we can statically determine the result.
        bool sameVal = srcIntConstVal == srcBoolConstVal;
        if (isBranchNotCompare)
        {
            // For constant branches, branch to the target
            Assert(instr);
            IR::LabelInstr * target = sameVal && srcIntIsBoolable ? equalResultTarget : inequalResultTarget;
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, target, this->m_func));
#if DBG
            // Since we're not making a non-helper path to one of the branches, we need to tell
            // DbCheckPostLower that we are going to have a non-helper label without non-helper
            // branches.
            // Note: this following line isn't good practice in general
            (sameVal && srcIntIsBoolable ? inequalResultTarget : equalResultTarget)->m_noHelperAssert = true;
#endif
        }
        else
        {
            // For constant compares, load the constant result
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, sameVal && srcIntIsBoolable ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    else if (!srcIntConst && !srcBoolConst)
    {
        // If neither is constant, we can still do a bit better than loading the helper
        IR::LabelInstr * firstFalse = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        IR::LabelInstr * forceInequal = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        // We branch based on the zero-ness of the integer argument to two checks against the boolean argument
        this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, firstFalse);
        // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
        // case the two will compare as inequal
        InsertCompareBranch(
            IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func, true),
            srcInt->AsRegOpnd(),
            Js::OpCode::BrNeq_A,
            isBranchNotCompare ? inequalResultTarget : forceInequal, // in the case of branching, we can go straight to the inequal target; for compares, we need to load the value
            instr,
            true);
        if (isBranchNotCompare)
        {
            // if the int evaluates to 1 (true)
            InsertCompareBranch(
                srcBool,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue),
                instr->m_opcode,
                targetInstr,
                instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));

            // if the int evaluates to 0 (false)
            instr->InsertBefore(firstFalse);
            InsertCompareBranch(
                srcBool,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse),
                instr->m_opcode,
                targetInstr,
                instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));
        }
        else
        {
            // the int resolves to 1 (true)
            // Load either the bool or its complement into the dst reg, depending on the opcode
            if (isNegOp)
            {
                GenerateBooleanNegate(instr, srcBool, instr->GetDst());
            }
            else
            {
                this->InsertMove(instr->GetDst(), srcBool, instr);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));

            // the int resolves to 0 (false)
            // Handle the complement case
            instr->InsertBefore(firstFalse);
            if (!isNegOp)
            {
                GenerateBooleanNegate(instr, srcBool, instr->GetDst());
            }
            else
            {
                this->InsertMove(instr->GetDst(), srcBool, instr);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));

            // the int resolves to something other than 0 or 1 (inequal to a bool)
            instr->InsertBefore(forceInequal);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    else if (srcIntConst)
    {
        if (isBranchNotCompare)
        {
            if (srcIntIsBoolable)
            {
                LibraryValue intval = srcIntConstVal ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
                InsertCompareBranch(
                    srcBool,
                    LoadLibraryValueOpnd(instr, intval),
                    instr->m_opcode,
                    targetInstr,
                    instr);
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelFallthrough, this->m_func));
            }
            else
            {
                // Since a constant int that isn't 0 or 1 will always be inequal to bools, just jump to the inequal result
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, inequalResultTarget, this->m_func));
#if DBG
                // Since we're not making a non-helper path to one of the branches, we need to tell
                // DbCheckPostLower that we are going to have a non-helper label without non-helper
                // branches.
                // Note: this following line isn't good practice in general
                equalResultTarget->m_noHelperAssert = true;
#endif
            }
        }
        else
        {
            if (srcIntIsBoolable)
            {
                bool directPassthrough = isNegOp != srcIntConstVal;
                if (directPassthrough)
                {
                    // If this case is hit, the result value is the same as the value in srcBool
                    this->InsertMove(instr->GetDst(), srcBool, instr);
                }
                else
                {
                    // Otherwise, the result value is the negation of the value in srcBool
                    GenerateBooleanNegate(instr, srcBool, instr->GetDst());
                }
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            }
            else
            {
                Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, inequalResultValue), instr);
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            }
        }
    }
    else if (srcBoolConst)
    {
        if (isBranchNotCompare)
        {
            this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, srcBoolConstVal ? inequalResultTarget : equalResultTarget);
            if (srcBoolConstVal)
            {
                // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
                // case we have an issue.
                InsertCompareBranch(IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func), srcInt->AsRegOpnd(), Js::OpCode::BrNeq_A, inequalResultTarget, instr, true);
            }
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, srcBoolConstVal ? equalResultTarget : inequalResultTarget, this->m_func));
        }
        else
        {
            IR::LabelInstr* isNonZero = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            IR::LabelInstr* isZero = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            this->m_lowererMD.GenerateTaggedZeroTest(srcInt->AsRegOpnd(), instr, isZero);
            if (srcBoolConstVal)
            {
                // If it's not zero, then it's either 1, in which case it's true, or it's something else, in which
                // case we have an issue.
                InsertCompareBranch(IR::IntConstOpnd::New((((IntConstType)1) << Js::VarTag_Shift) + Js::AtomTag, IRType::TyVar, this->m_func), srcInt->AsRegOpnd(), Js::OpCode::BrNeq_A, isZero, instr, true);
            }
            instr->InsertBefore(isNonZero);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, srcBoolConstVal ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
            instr->InsertBefore(isZero);
            Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, !srcBoolConstVal ? equalResultValue : inequalResultValue), instr);
            instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func));
        }
    }
    if (*pNeedHelper)
    {
        instr->InsertBefore(labelHelper);
    }
    return true;
}